

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::MapFieldBase::MapBegin(MapFieldBase *this,MapIterator *map_iter)

{
  UntypedMapBase *this_00;
  UntypedMapIterator *this_01;
  UntypedMapIterator local_28;
  
  this_01 = &local_28;
  this_00 = MapFieldBaseForParse::GetMap(&this->super_MapFieldBaseForParse);
  UntypedMapBase::begin(&local_28,this_00);
  (map_iter->iter_).bucket_index_ = local_28.bucket_index_;
  *(undefined4 *)&(map_iter->iter_).field_0x14 = local_28._20_4_;
  (map_iter->iter_).node_ = local_28.node_;
  (map_iter->iter_).m_ = local_28.m_;
  SetMapIteratorValue((MapFieldBase *)this_01,map_iter);
  return;
}

Assistant:

void MapFieldBase::MapBegin(MapIterator* map_iter) const {
  map_iter->iter_ = GetMap().begin();
  SetMapIteratorValue(map_iter);
}